

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientService.cpp
# Opt level: O2

bool __thiscall ClientService::startService(ClientService *this)

{
  int iVar1;
  uint socketFD;
  byte *pbVar2;
  ClientSegment *this_00;
  ClientService *pCVar3;
  sockaddr_in serverDetails;
  
  pCVar3 = (ClientService *)this->clientSocketUDP;
  serverDetails = ClientSocketUDP::setupServer((ClientSocketUDP *)pCVar3);
  pbVar2 = initRequest(pCVar3,this->data);
  pCVar3 = (ClientService *)this->clientSocketUDP;
  iVar1 = ClientSocketUDP::getSocket((ClientSocketUDP *)pCVar3);
  sendPacket(pCVar3,pbVar2,iVar1,serverDetails);
  socketFD = ClientSocketUDP::getSocket(this->clientSocketUDP);
  pbVar2 = (byte *)(ulong)socketFD;
  receiveResponse(this,socketFD,serverDetails,(long)this->windowSize,0,0);
  iVar1 = rand();
  this_00 = (ClientSegment *)operator_new(0x18);
  ClientSegment::ClientSegment(this_00,10,'N',pbVar2,iVar1 % 100,'N',0,0);
  pbVar2 = ClientSegment::prepareSegment(this_00);
  return SUB81(pbVar2,0);
}

Assistant:

bool ClientService::startService() {
    struct sockaddr_in severSettings;
    severSettings = clientSocketUDP->setupServer();
    byte *header = initRequest(data);
    sendPacket(header, clientSocketUDP->getSocket(), severSettings);
    receiveResponse(clientSocketUDP->getSocket(), severSettings, windowSize);
    free(header);
}